

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_doc.c
# Opt level: O2

HPDF_STATUS HPDF_Doc_SetEncryptOn(HPDF_Doc pdf)

{
  HPDF_STATUS HVar1;
  HPDF_EncryptDict obj;
  
  if (pdf->encrypt_on == 0) {
    obj = pdf->encrypt_dict;
    if (obj == (HPDF_EncryptDict)0x0) {
      HVar1 = HPDF_SetError(&pdf->error,0x100b,0);
      return HVar1;
    }
    if ((obj->header).obj_id == 0) {
      HVar1 = HPDF_Xref_Add(pdf->xref,obj);
      if (HVar1 == 0) {
        obj = pdf->encrypt_dict;
        goto LAB_001183e1;
      }
    }
    else {
LAB_001183e1:
      HVar1 = HPDF_Dict_Add(pdf->trailer,"Encrypt",obj);
      if (HVar1 == 0) {
        pdf->encrypt_on = 1;
        goto LAB_001183c9;
      }
    }
    HVar1 = (pdf->error).error_no;
  }
  else {
LAB_001183c9:
    HVar1 = 0;
  }
  return HVar1;
}

Assistant:

HPDF_STATUS
HPDF_Doc_SetEncryptOn  (HPDF_Doc   pdf)
{
    HPDF_PTRACE ((" HPDF_Doc_SetEncryptOn\n"));

    if (pdf->encrypt_on)
        return HPDF_OK;

    if (!pdf->encrypt_dict)
        return HPDF_SetError (&pdf->error, HPDF_DOC_ENCRYPTDICT_NOT_FOUND,
                0);

    if (pdf->encrypt_dict->header.obj_id == HPDF_OTYPE_NONE)
        if (HPDF_Xref_Add (pdf->xref, pdf->encrypt_dict) != HPDF_OK)
            return pdf->error.error_no;

    if (HPDF_Dict_Add (pdf->trailer, "Encrypt", pdf->encrypt_dict) != HPDF_OK)
        return pdf->error.error_no;

    pdf->encrypt_on = HPDF_TRUE;

    return HPDF_OK;
}